

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O1

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  uint uVar1;
  double *__ptr;
  char **ppcVar2;
  char *__ptr_00;
  ulong uVar3;
  
  if (args_info->output_arg != (char *)0x0) {
    free(args_info->output_arg);
    args_info->output_arg = (char *)0x0;
  }
  if (args_info->output_orig != (char *)0x0) {
    free(args_info->output_orig);
    args_info->output_orig = (char *)0x0;
  }
  if (args_info->density_orig != (char *)0x0) {
    free(args_info->density_orig);
    args_info->density_orig = (char *)0x0;
  }
  if (args_info->nx_orig != (char *)0x0) {
    free(args_info->nx_orig);
    args_info->nx_orig = (char *)0x0;
  }
  if (args_info->ny_orig != (char *)0x0) {
    free(args_info->ny_orig);
    args_info->ny_orig = (char *)0x0;
  }
  if (args_info->nz_orig != (char *)0x0) {
    free(args_info->nz_orig);
    args_info->nz_orig = (char *)0x0;
  }
  __ptr = args_info->molFraction_arg;
  if (__ptr != (double *)0x0) {
    uVar1 = args_info->molFraction_given;
    if ((ulong)uVar1 != 0) {
      uVar3 = 0;
      do {
        ppcVar2 = args_info->molFraction_orig;
        __ptr_00 = ppcVar2[uVar3];
        if (__ptr_00 != (char *)0x0) {
          free(__ptr_00);
          ppcVar2[uVar3] = (char *)0x0;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    free(__ptr);
    free(args_info->molFraction_orig);
    args_info->molFraction_orig = (char **)0x0;
  }
  args_info->molFraction_arg = (double *)0x0;
  if (args_info->lattice_arg != (char *)0x0) {
    free(args_info->lattice_arg);
    args_info->lattice_arg = (char *)0x0;
  }
  if (args_info->lattice_orig != (char *)0x0) {
    free(args_info->lattice_orig);
    args_info->lattice_orig = (char *)0x0;
  }
  if (args_info->inputs_num != 0) {
    uVar3 = 0;
    do {
      free(args_info->inputs[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < args_info->inputs_num);
    if (args_info->inputs_num != 0) {
      free(args_info->inputs);
    }
  }
  args_info->nx_given = 0;
  args_info->ny_given = 0;
  args_info->nz_given = 0;
  args_info->molFraction_given = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->output_given = 0;
  args_info->density_given = 0;
  args_info->lattice_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->density_orig));
  free_string_field (&(args_info->nx_orig));
  free_string_field (&(args_info->ny_orig));
  free_string_field (&(args_info->nz_orig));
  free_multiple_field (args_info->molFraction_given, (void *)(args_info->molFraction_arg), &(args_info->molFraction_orig));
  args_info->molFraction_arg = 0;
  free_string_field (&(args_info->lattice_arg));
  free_string_field (&(args_info->lattice_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}